

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O2

void __thiscall MetaDCEGraph::MetaDCEGraph(MetaDCEGraph *this,Module *wasm)

{
  long lVar1;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  ModuleItemKind local_50 [7];
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  (this->nodes)._M_h._M_buckets = &(this->nodes)._M_h._M_single_bucket;
  (this->nodes)._M_h._M_bucket_count = 1;
  (this->nodes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes)._M_h._M_element_count = 0;
  (this->nodes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->roots)._M_h._M_buckets = &(this->roots)._M_h._M_single_bucket;
  (this->roots)._M_h._M_bucket_count = 1;
  (this->roots)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->roots)._M_h._M_element_count = 0;
  (this->roots)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->roots)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->roots)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->exportToDCENode)._M_h._M_buckets = &(this->exportToDCENode)._M_h._M_single_bucket;
  (this->exportToDCENode)._M_h._M_bucket_count = 1;
  (this->exportToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exportToDCENode)._M_h._M_element_count = 0;
  (this->exportToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exportToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exportToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->itemToDCENode)._M_h._M_buckets = &(this->itemToDCENode)._M_h._M_single_bucket;
  (this->itemToDCENode)._M_h._M_bucket_count = 1;
  (this->itemToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->itemToDCENode)._M_h._M_element_count = 0;
  (this->itemToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->itemToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->itemToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->importIdToDCENode)._M_h._M_buckets = &(this->importIdToDCENode)._M_h._M_single_bucket;
  (this->importIdToDCENode)._M_h._M_bucket_count = 1;
  (this->importIdToDCENode)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->importIdToDCENode)._M_h._M_element_count = 0;
  (this->importIdToDCENode)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->importIdToDCENode)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->importIdToDCENode)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->wasm = wasm;
  local_50[0] = Function;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[5],_true>(&local_168,local_50,(char (*) [5])0x1324ca);
  local_50[1] = 1;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[6],_true>
            (&local_140,local_50 + 1,(char (*) [6])"table");
  local_50[2] = 2;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[7],_true>
            (&local_118,local_50 + 2,(char (*) [7])0x1317c5);
  local_50[3] = 3;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[7],_true>
            (&local_f0,local_50 + 3,(char (*) [7])"global");
  local_50[4] = 4;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[4],_true>(&local_c8,local_50 + 4,(char (*) [4])"tag");
  local_50[5] = 5;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[5],_true>(&local_a0,local_50 + 5,(char (*) [5])"dseg")
  ;
  local_50[6] = 6;
  std::
  pair<const_wasm::ModuleItemKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<wasm::ModuleItemKind,_const_char_(&)[5],_true>(&local_78,local_50 + 6,(char (*) [5])"eseg")
  ;
  std::
  _Hashtable<wasm::ModuleItemKind,std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<wasm::ModuleItemKind>,std::hash<wasm::ModuleItemKind>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>const*>
            ((_Hashtable<wasm::ModuleItemKind,std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<wasm::ModuleItemKind>,std::hash<wasm::ModuleItemKind>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->kindPrefixes,&local_168,local_50,0,&local_33,&local_32,&local_31);
  lVar1 = 0xf8;
  do {
    std::__cxx11::string::~string((string *)((long)&local_168.first + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  this->nameIndex = 0;
  (this->reached)._M_h._M_buckets = &(this->reached)._M_h._M_single_bucket;
  (this->reached)._M_h._M_bucket_count = 1;
  (this->reached)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->reached)._M_h._M_element_count = 0;
  (this->reached)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->reached)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->reached)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MetaDCEGraph(Module& wasm) : wasm(wasm) {}